

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSource.h
# Opt level: O2

bool __thiscall COLLADASaxFWL::SourceBase::isLoadedInputElement(SourceBase *this,Semantic *semantic)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (this->mLoadedInputElements).mCount;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (uVar1 == uVar3) break;
    uVar2 = uVar3 + 1;
  } while ((this->mLoadedInputElements).mData[uVar3] != *semantic);
  return uVar3 < uVar1;
}

Assistant:

bool isLoadedInputElement ( const InputSemantic::Semantic& semantic )
        {
            const size_t numLoadedInputElements = mLoadedInputElements.getCount ();
            for ( size_t i=0; i<numLoadedInputElements; ++i )
            {
                InputSemantic::Semantic& currentSemantic = mLoadedInputElements [i];
                if ( currentSemantic == semantic ) return true;
            }

            return false;
        }